

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::PrimitiveFieldGenerator::GenerateSerializationCode
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  char *text;
  
  if ((*(int *)(this->descriptor_ + 0x4c) == 2) &&
     (((this->super_FieldGenerator).params_)->generate_has_ != true)) {
    text = "output.write$capitalized_type$($number$, this.$name$);\n";
  }
  else {
    GenerateSerializationConditional(this,printer);
    text = "  output.write$capitalized_type$($number$, this.$name$);\n}\n";
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  if (descriptor_->is_required() && !params_.generate_has()) {
    // Always serialize a required field if we don't have the 'has' signal.
    printer->Print(variables_,
      "output.write$capitalized_type$($number$, this.$name$);\n");
  } else {
    GenerateSerializationConditional(printer);
    printer->Print(variables_,
      "  output.write$capitalized_type$($number$, this.$name$);\n"
      "}\n");
  }
}